

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O3

Error __thiscall asmjit::FuncArgsContext::markStackArgsReg(FuncArgsContext *this,FuncFrame *frame)

{
  uint8_t uVar1;
  
  if ((ulong)this->_saVarId == 0xff) {
    if ((frame->_attributes & 0x10) == 0) {
      return 0;
    }
    uVar1 = this->_archTraits->_fpRegId;
  }
  else {
    uVar1 = *(uint8_t *)((long)&this->_vars[this->_saVarId].cur._data + 2);
  }
  frame->_saRegId = uVar1;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::markStackArgsReg(FuncFrame& frame) noexcept {
  if (_saVarId != kVarIdNone) {
    const Var& var = _vars[_saVarId];
    frame.setSARegId(var.cur.regId());
  }
  else if (frame.hasPreservedFP()) {
    frame.setSARegId(archTraits().fpRegId());
  }

  return kErrorOk;
}